

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeekstat.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t __size;
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint *__base;
  size_t sVar5;
  char *__ptr;
  ulong uVar6;
  size_t sStack_50;
  uint auStack_48 [4];
  int local_38;
  int32_t a;
  int cnum;
  int32_t b;
  
  sStack_50 = 0x101237;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    local_38 = 0;
    do {
      while( true ) {
        sStack_50 = 0x101269;
        iVar2 = getopt(argc,argv,"c:");
        if (iVar2 != 99) break;
        sStack_50 = 0x101286;
        __isoc99_sscanf(_optarg,"%d",&local_38);
      }
    } while (iVar2 != -1);
    if (local_38 < nva_cardsnum) {
      a = 10000;
      if (_optind < argc) {
        uVar6 = 0;
        sStack_50 = 0x1012cd;
        __isoc99_sscanf(argv[_optind],"%x",auStack_48 + 3);
        uVar3 = 10000;
        if (_optind + 1 < argc) {
          sStack_50 = 0x1012f7;
          __isoc99_sscanf(argv[(long)_optind + 1],"%d",&a);
          uVar3 = (ulong)(uint)a;
        }
        lVar1 = -(uVar3 * 4 + 0xf & 0xfffffffffffffff0);
        __base = (uint *)((long)auStack_48 + lVar1);
        sVar5 = (size_t)a;
        lVar4 = (long)local_38;
        uVar3 = 0;
        if (0 < a) {
          uVar3 = (ulong)(uint)a;
        }
        for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          __base[uVar6] = *(uint *)((long)nva_cards[lVar4].bar0 + (ulong)auStack_48[3]);
        }
        *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 4;
        __size = *(size_t *)((long)auStack_48 + lVar1 + -8);
        *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 0x101361;
        qsort(__base,sVar5,__size,cmp);
        uVar6 = (ulong)*__base;
        uVar3 = 0;
        for (lVar4 = 0; lVar4 < a; lVar4 = lVar4 + 1) {
          if (__base[lVar4] != (uint)uVar6) {
            *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 0x101388;
            printf("%08x: %d\n",uVar6,uVar3);
            uVar6 = (ulong)__base[lVar4];
            uVar3 = 0;
          }
          uVar3 = (ulong)((int)uVar3 + 1);
        }
        *(undefined8 *)((long)auStack_48 + lVar1 + -8) = 0x1013a5;
        printf("%08x: %d\n",uVar6,uVar3);
        return 0;
      }
      __ptr = "No address specified.\n";
      sStack_50 = 0x16;
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_50 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_50 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_50 = 0x12;
  }
  sVar5 = sStack_50;
  sStack_50 = 0x10140e;
  fwrite(__ptr,sVar5,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 10000, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%d", &b);
	uint32_t tab[b];
	for (i = 0; i < b; i++)
		tab[i] = nva_rd32(cnum, a);
	qsort(tab, b, sizeof *tab, cmp);
	uint32_t prev = tab[0];
	int cnt = 0;
	for (i = 0; i < b; i++) {
		if (tab[i] != prev) {
			printf("%08x: %d\n", prev, cnt);
			cnt = 0;
			prev = tab[i];
		}
		cnt++;
	}
	printf("%08x: %d\n", prev, cnt);
	return 0;
}